

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoissonGenerator.h
# Opt level: O2

vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *
PoissonGenerator::generateJitteredGridPoints<PoissonGenerator::DefaultPRNG>
          (vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
           *__return_storage_ptr__,uint32_t numPoints,DefaultPRNG *generator,bool isCircle,
          float jitterRadius,Point center)

{
  double dVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint32_t y;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float fVar11;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float fVar12;
  float extraout_XMM0_Dd_01;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  Point PVar13;
  value_type local_88;
  Point local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fStack_50 = (float)in_XMM1_Dc;
  local_58 = center._0_8_;
  fStack_4c = (float)in_XMM1_Dd;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::reserve
            (__return_storage_ptr__,(ulong)numPoints);
  dVar1 = SQRT((double)numPoints);
  fVar10 = (float)((ulong)dVar1 >> 0x20);
  uVar7 = (ulong)dVar1;
  uVar6 = (uint)uVar7;
  fVar8 = (float)(uVar7 & 0xffffffff);
  fVar11 = extraout_XMM0_Dc;
  fVar12 = extraout_XMM0_Dd;
  for (uVar4 = 0; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    local_68 = (float)uVar4 / fVar8;
    fStack_64 = fVar10;
    fStack_60 = fVar11;
    fStack_5c = fVar12;
    for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      local_88.x = 0.0;
      local_88.y = 0.0;
      local_88.valid_ = false;
      fStack_44 = (float)uVar5 / fVar8;
      local_48 = local_68;
      fStack_40 = fStack_60;
      fStack_3c = fStack_5c;
      do {
        do {
          local_78.x = 0.0;
          local_78.y = 0.0;
          local_78.valid_ = true;
          PVar13 = generateRandomPointAround<PoissonGenerator::DefaultPRNG>
                             (&local_78,jitterRadius,generator);
          fVar9 = (PVar13.x - (float)local_58._0_4_) + 0.5 + local_48;
          fVar10 = (PVar13.y - (float)local_58._4_4_) + 0.5 + fStack_44;
          fVar11 = (extraout_XMM0_Dc_00 - fStack_50) + 0.0 + fStack_40;
          fVar12 = (extraout_XMM0_Dd_00 - fStack_4c) + 0.0 + fStack_3c;
          local_88.y = fVar10;
          local_88.x = fVar9;
          local_88.valid_ = true;
        } while (fVar9 < 0.0);
        auVar2._4_4_ = -(uint)(fVar9 <= 1.0);
        auVar2._0_4_ = -(uint)(fVar9 <= 1.0);
        auVar2._8_4_ = -(uint)(fVar10 <= 1.0);
        auVar2._12_4_ = -(uint)(fVar10 <= 1.0);
        uVar3 = movmskpd(PVar13._8_4_,auVar2);
      } while ((((uVar3 & 2) == 0) || ((uVar3 & 1) == 0)) || (fVar10 < 0.0));
      if ((!isCircle) ||
         ((fVar9 + -0.5) * (fVar9 + -0.5) + (fVar10 + -0.5) * (fVar10 + -0.5) <= 0.25)) {
        std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::push_back
                  (__return_storage_ptr__,&local_88);
        fVar10 = extraout_XMM0_Db;
        fVar11 = extraout_XMM0_Dc_01;
        fVar12 = extraout_XMM0_Dd_01;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Point> generateJitteredGridPoints(uint32_t numPoints,
                                              PRNG& generator,
                                              bool isCircle = false,
                                              float jitterRadius = 0.004f,
                                              Point center = Point(0.5f, 0.5f)) {
  std::vector<Point> samplePoints;

  samplePoints.reserve(numPoints);

  const uint32_t gridSize = uint32_t(sqrt(numPoints));

  for (uint32_t x = 0; x != gridSize; x++) {
    for (uint32_t y = 0; y != gridSize; y++) {
      Point p;
      do {
        const Point offs = generateRandomPointAround(Point(0, 0), jitterRadius, generator) - center + Point(0.5f, 0.5f);
        p = Point(float(x) / gridSize, float(y) / gridSize) + offs;
        // generate a new point until it is within the boundaries
      } while (!p.isInRectangle());

      if (isCircle)
        if (!p.isInCircle())
          continue;

      samplePoints.push_back(p);
    }
  }

  return samplePoints;
}